

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5bf3::TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents::
~TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents
          (TestCheckArray2DCloseFailureOnExceptionIncludesCheckContents *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureOnExceptionIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {2, 3} };
        ThrowingObject2D obj;
        CHECK_ARRAY2D_CLOSE (data, obj, 2, 2, 0.01f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "data"));
    CHECK(strstr(reporter.lastFailedMessage, "obj"));
}